

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void decode_opc_mxu(CPUMIPSState_conflict2 *env,DisasContext_conflict4 *ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  TCGv_i32 pTVar8;
  TCGLabel *l;
  TCGv_i32 pTVar9;
  TCGv_i32 pTVar10;
  TCGv_i32 pTVar11;
  TCGv_i32 pTVar12;
  TCGv_i32 pTVar13;
  TCGv_i32 pTVar14;
  TCGv_i32 ret;
  TCGv_i32 t;
  int32_t iVar15;
  int arg2;
  uintptr_t o;
  TCGContext_conflict4 *tcg_ctx;
  int iVar16;
  uintptr_t o_3;
  TCGTemp *pTVar17;
  TCGContext_conflict4 *tcg_ctx_00;
  uint len;
  int iVar18;
  uintptr_t o_2;
  uintptr_t o_12;
  byte bVar19;
  uintptr_t o_7;
  uintptr_t o_1;
  
  tcg_ctx = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
  uVar1 = extract32((env->active_tc).gpr[10],0,6);
  if (uVar1 == 0x2f) {
    tcg_ctx = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
    pTVar8 = tcg_temp_new_i32(tcg_ctx);
    uVar1 = extract32((env->active_tc).gpr[10],6,5);
    uVar2 = extract32((env->active_tc).gpr[10],0x10,5);
    gen_load_gpr(tcg_ctx,pTVar8,uVar2);
    if (uVar1 < 0x10) {
      gen_store_mxu_gpr(tcg_ctx,pTVar8,uVar1);
    }
    else if (uVar1 == 0x10) {
      tcg_gen_mov_i32(tcg_ctx,tcg_ctx->mxu_CR,pTVar8);
    }
LAB_00775727:
    pTVar17 = (TCGTemp *)(pTVar8 + (long)tcg_ctx);
    goto LAB_00775f66;
  }
  if (uVar1 == 0x2e) {
    tcg_ctx = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
    pTVar8 = tcg_temp_new_i32(tcg_ctx);
    uVar1 = extract32((env->active_tc).gpr[10],6,5);
    uVar2 = extract32((env->active_tc).gpr[10],0x10,5);
    if (uVar1 < 0x10) {
      gen_load_mxu_gpr(tcg_ctx,pTVar8,uVar1);
    }
    else if (uVar1 == 0x10) {
      gen_load_mxu_cr(tcg_ctx,pTVar8);
    }
    gen_store_gpr(tcg_ctx,pTVar8,uVar2);
    goto LAB_00775727;
  }
  if (uVar1 == 2) {
    uVar1 = extract32((env->active_tc).gpr[10],0x15,5);
    uVar2 = extract32((env->active_tc).gpr[10],0x10,5);
    uVar3 = extract32((env->active_tc).gpr[10],0xb,5);
    gen_arith((DisasContext_conflict4 *)env,(env->active_tc).gpr[10] & 0xfc00003f,uVar3,uVar1,uVar2)
    ;
    return;
  }
  pTVar8 = tcg_temp_new_i32(tcg_ctx);
  l = gen_new_label_mipsel(tcg_ctx);
  gen_load_mxu_cr(tcg_ctx,pTVar8);
  tcg_gen_andi_i32_mipsel(tcg_ctx,pTVar8,pTVar8,0);
  tcg_gen_brcondi_i32_mipsel(tcg_ctx,TCG_COND_NE,pTVar8,0,l);
  switch(uVar1) {
  default:
    goto switchD_007756f8_caseD_0;
  case 3:
    uVar1 = extract32((env->active_tc).gpr[10],0x12,3);
    switch(uVar1) {
    case 0:
    case 1:
      tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
      uVar2 = extract32((env->active_tc).gpr[10],0x15,5);
      uVar3 = extract32((env->active_tc).gpr[10],0x12,3);
      uVar1 = extract32((env->active_tc).gpr[10],0xe,4);
      uVar5 = extract32((env->active_tc).gpr[10],10,4);
      uVar4 = extract32((env->active_tc).gpr[10],6,4);
      if ((uVar2 == 0) && (uVar4 != 0)) {
        if (uVar5 == 0 && uVar1 == 0) goto LAB_00776f69;
        if ((uVar5 == 0) || (uVar1 == 0)) {
          if (uVar5 != 0) {
            uVar1 = uVar5;
          }
          pTVar9 = tcg_ctx_00->mxu_gpr[uVar4 - 1];
          pTVar10 = tcg_ctx_00->mxu_gpr[uVar1 - 1];
          if (uVar3 == 0) {
            pTVar11 = (TCGv_i32)0x0;
LAB_00776dea:
            tcg_gen_smax_i32_mipsel(tcg_ctx_00,pTVar9,pTVar10,pTVar11);
            break;
          }
          pTVar11 = (TCGv_i32)0x0;
        }
        else {
          if (uVar5 == uVar1) goto LAB_00776f7b;
          pTVar9 = tcg_ctx_00->mxu_gpr[uVar4 - 1];
          pTVar10 = tcg_ctx_00->mxu_gpr[uVar5 - 1];
          pTVar11 = tcg_ctx_00->mxu_gpr[uVar1 - 1];
          if (uVar3 == 0) goto LAB_00776dea;
        }
        tcg_gen_smin_i32_mipsel(tcg_ctx_00,pTVar9,pTVar10,pTVar11);
      }
      break;
    case 2:
    case 3:
      tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
      uVar2 = extract32((env->active_tc).gpr[10],0x15,5);
      uVar3 = extract32((env->active_tc).gpr[10],0x12,3);
      uVar1 = extract32((env->active_tc).gpr[10],0xe,4);
      uVar4 = extract32((env->active_tc).gpr[10],10,4);
      uVar5 = extract32((env->active_tc).gpr[10],6,4);
      if ((uVar2 == 0) && (uVar1 != 0)) {
        if (uVar4 == 0 && uVar5 == 0) {
          pTVar9 = tcg_ctx_00->mxu_gpr[uVar1 - 1];
          goto LAB_007773f2;
        }
        if ((uVar4 == 0) || (uVar5 == 0)) {
          if (uVar4 != 0) {
            uVar1 = uVar4;
          }
          pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
          pTVar10 = tcg_const_i32_mipsel(tcg_ctx_00,0);
          tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar1 - 1],-0x10000);
          if (uVar3 == 2) {
            tcg_gen_smax_i32_mipsel(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],pTVar9,pTVar10);
          }
          else {
            tcg_gen_smin_i32_mipsel(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],pTVar9,pTVar10);
          }
          tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar1 - 1],0xffff);
          tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,0x10);
          if (uVar3 == 2) {
            tcg_gen_smax_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,pTVar10);
          }
          else {
            tcg_gen_smin_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,pTVar10);
          }
          tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,0x10);
          tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],tcg_ctx_00->mxu_gpr[uVar5 - 1],
                         pTVar9);
          pTVar17 = (TCGTemp *)(pTVar10 + (long)tcg_ctx_00);
LAB_00776dd4:
          tcg_temp_free_internal_mipsel(tcg_ctx_00,pTVar17);
          pTVar17 = (TCGTemp *)(pTVar9 + (long)tcg_ctx_00);
          goto LAB_00776884;
        }
        if (uVar4 == uVar1) {
          pTVar9 = tcg_ctx_00->mxu_gpr[uVar5 - 1];
LAB_007770f7:
          pTVar10 = tcg_ctx_00->mxu_gpr[uVar1 - 1];
          goto LAB_00777449;
        }
        pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
        pTVar10 = tcg_temp_new_i32(tcg_ctx_00);
        tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar4 - 1],-0x10000);
        tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar10,tcg_ctx_00->mxu_gpr[uVar1 - 1],-0x10000);
        if (uVar3 == 2) {
          tcg_gen_smax_i32_mipsel(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],pTVar9,pTVar10);
        }
        else {
          tcg_gen_smin_i32_mipsel(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],pTVar9,pTVar10);
        }
        tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar4 - 1],0xffff);
        tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar10,tcg_ctx_00->mxu_gpr[uVar1 - 1],0xffff);
        tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,0x10);
        tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar10,pTVar10,0x10);
        if (uVar3 == 2) {
          tcg_gen_smax_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,pTVar10);
        }
        else {
          tcg_gen_smin_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,pTVar10);
        }
        tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,0x10);
        tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],tcg_ctx_00->mxu_gpr[uVar5 - 1],
                       pTVar9);
        pTVar17 = (TCGTemp *)(pTVar10 + (long)tcg_ctx_00);
LAB_00776cbb:
        tcg_temp_free_internal_mipsel(tcg_ctx_00,pTVar17);
        pTVar17 = (TCGTemp *)(pTVar9 + (long)tcg_ctx_00);
        goto LAB_00776cc9;
      }
      break;
    case 4:
    case 5:
      tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
      uVar2 = extract32((env->active_tc).gpr[10],0x15,5);
      uVar3 = extract32((env->active_tc).gpr[10],0x12,3);
      uVar1 = extract32((env->active_tc).gpr[10],0xe,4);
      uVar4 = extract32((env->active_tc).gpr[10],10,4);
      uVar5 = extract32((env->active_tc).gpr[10],6,4);
      if ((uVar2 == 0) && (uVar5 != 0)) {
        if (uVar4 != 0 || uVar1 != 0) {
          if ((uVar4 != 0) && (uVar1 != 0)) {
            if (uVar4 == uVar1) {
              pTVar9 = tcg_ctx_00->mxu_gpr[uVar5 - 1];
              goto LAB_007770f7;
            }
            pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
            pTVar10 = tcg_temp_new_i32(tcg_ctx_00);
            tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar4 - 1],-0x1000000);
            tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar10,tcg_ctx_00->mxu_gpr[uVar1 - 1],-0x1000000);
            if (uVar3 == 4) {
              tcg_gen_smax_i32_mipsel(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],pTVar9,pTVar10);
            }
            else {
              tcg_gen_smin_i32_mipsel(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],pTVar9,pTVar10);
            }
            iVar16 = 8;
            bVar19 = 0x10;
            for (iVar18 = 2; -1 < iVar18; iVar18 = iVar18 + -1) {
              arg2 = 0xff << (bVar19 & 0x1f);
              tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar4 - 1],arg2);
              tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar10,tcg_ctx_00->mxu_gpr[uVar1 - 1],arg2);
              tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,iVar16);
              tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar10,pTVar10,iVar16);
              if (uVar3 == 4) {
                tcg_gen_smax_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,pTVar10);
              }
              else {
                tcg_gen_smin_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,pTVar10);
              }
              tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,iVar16);
              tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],
                             tcg_ctx_00->mxu_gpr[uVar5 - 1],pTVar9);
              iVar16 = iVar16 + 8;
              bVar19 = bVar19 - 8;
            }
            pTVar17 = (TCGTemp *)(pTVar10 + (long)tcg_ctx_00);
            goto LAB_00776dd4;
          }
          if (uVar4 != 0) {
            uVar1 = uVar4;
          }
          pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
          pTVar10 = tcg_const_i32_mipsel(tcg_ctx_00,0);
          tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar1 - 1],-0x1000000);
          if (uVar3 == 4) {
            tcg_gen_smax_i32_mipsel(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],pTVar9,pTVar10);
          }
          else {
            tcg_gen_smin_i32_mipsel(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],pTVar9,pTVar10);
          }
          iVar16 = 8;
          bVar19 = 0x10;
          for (iVar18 = 2; -1 < iVar18; iVar18 = iVar18 + -1) {
            tcg_gen_andi_i32_mipsel
                      (tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar1 - 1],0xff << (bVar19 & 0x1f));
            tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,iVar16);
            if (uVar3 == 4) {
              tcg_gen_smax_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,pTVar10);
            }
            else {
              tcg_gen_smin_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,pTVar10);
            }
            tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,iVar16);
            tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],tcg_ctx_00->mxu_gpr[uVar5 - 1],
                           pTVar9);
            iVar16 = iVar16 + 8;
            bVar19 = bVar19 - 8;
          }
          tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar10 + (long)tcg_ctx_00));
          pTVar17 = (TCGTemp *)(pTVar9 + (long)tcg_ctx_00);
          goto LAB_00776884;
        }
        pTVar9 = tcg_ctx_00->mxu_gpr[uVar5 - 1];
LAB_007773f2:
        iVar15 = 0;
LAB_007773f4:
        tcg_gen_movi_i32(tcg_ctx_00,pTVar9,iVar15);
      }
      break;
    default:
      goto switchD_007756f8_caseD_0;
    }
    goto switchD_0077606e_default;
  case 6:
  case 7:
  case 0x36:
  case 0x39:
    uVar1 = (env->active_tc).gpr[10];
    iVar18 = 0x12;
    iVar16 = 3;
    goto LAB_00775f3e;
  case 8:
    tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
    pTVar11 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar12 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar13 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar14 = tcg_temp_new_i32(tcg_ctx_00);
    uVar1 = extract32((env->active_tc).gpr[10],6,4);
    uVar2 = extract32((env->active_tc).gpr[10],10,4);
    uVar3 = extract32((env->active_tc).gpr[10],0xe,4);
    uVar4 = extract32((env->active_tc).gpr[10],0x12,4);
    uVar5 = extract32((env->active_tc).gpr[10],0x16,2);
    gen_load_mxu_gpr(tcg_ctx_00,pTVar12,uVar2);
    tcg_gen_sextract_i32_mipsel(tcg_ctx_00,pTVar11,pTVar12,0,0x10);
    tcg_gen_sextract_i32_mipsel(tcg_ctx_00,pTVar12,pTVar12,0x10,0x10);
    gen_load_mxu_gpr(tcg_ctx_00,pTVar14,uVar3);
    tcg_gen_sextract_i32_mipsel(tcg_ctx_00,pTVar13,pTVar14,0,0x10);
    tcg_gen_sextract_i32_mipsel(tcg_ctx_00,pTVar14,pTVar14,0x10,0x10);
    pTVar9 = pTVar11;
    pTVar10 = pTVar11;
    switch(uVar5) {
    case 0:
      pTVar9 = pTVar12;
      break;
    case 1:
      break;
    case 2:
      pTVar9 = pTVar12;
      pTVar10 = pTVar12;
      break;
    case 3:
      pTVar10 = pTVar12;
      break;
    default:
      goto switchD_00775f1b_default;
    }
    tcg_gen_mul_i32(tcg_ctx_00,pTVar14,pTVar9,pTVar14);
    tcg_gen_mul_i32(tcg_ctx_00,pTVar13,pTVar10,pTVar13);
switchD_00775f1b_default:
    gen_store_mxu_gpr(tcg_ctx_00,pTVar14,uVar1);
    gen_store_mxu_gpr(tcg_ctx_00,pTVar13,uVar4);
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar11 + (long)tcg_ctx_00));
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar12 + (long)tcg_ctx_00));
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar13 + (long)tcg_ctx_00));
    pTVar17 = (TCGTemp *)(pTVar14 + (long)tcg_ctx_00);
    goto LAB_00776cc9;
  case 9:
    uVar1 = (env->active_tc).gpr[10];
    iVar18 = 0x18;
    break;
  case 10:
    tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
    pTVar11 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar12 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar13 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar14 = tcg_temp_new_i32(tcg_ctx_00);
    uVar1 = extract32((env->active_tc).gpr[10],6,4);
    uVar2 = extract32((env->active_tc).gpr[10],10,4);
    uVar3 = extract32((env->active_tc).gpr[10],0xe,4);
    uVar4 = extract32((env->active_tc).gpr[10],0x12,4);
    uVar5 = extract32((env->active_tc).gpr[10],0x16,2);
    uVar6 = extract32((env->active_tc).gpr[10],0x18,2);
    gen_load_mxu_gpr(tcg_ctx_00,pTVar12,uVar2);
    tcg_gen_sextract_i32_mipsel(tcg_ctx_00,pTVar11,pTVar12,0,0x10);
    tcg_gen_sextract_i32_mipsel(tcg_ctx_00,pTVar12,pTVar12,0x10,0x10);
    gen_load_mxu_gpr(tcg_ctx_00,pTVar14,uVar3);
    tcg_gen_sextract_i32_mipsel(tcg_ctx_00,pTVar13,pTVar14,0,0x10);
    tcg_gen_sextract_i32_mipsel(tcg_ctx_00,pTVar14,pTVar14,0x10,0x10);
    pTVar9 = pTVar12;
    pTVar10 = pTVar11;
    switch(uVar5) {
    case 0:
      break;
    case 1:
      pTVar9 = pTVar11;
      break;
    case 2:
      pTVar10 = pTVar12;
      break;
    case 3:
      pTVar9 = pTVar11;
      pTVar10 = pTVar12;
      break;
    default:
      goto switchD_00775b93_default;
    }
    tcg_gen_mul_i32(tcg_ctx_00,pTVar14,pTVar9,pTVar14);
    tcg_gen_mul_i32(tcg_ctx_00,pTVar13,pTVar10,pTVar13);
switchD_00775b93_default:
    gen_load_mxu_gpr(tcg_ctx_00,pTVar11,uVar1);
    gen_load_mxu_gpr(tcg_ctx_00,pTVar12,uVar4);
    switch(uVar6) {
    case 0:
      tcg_gen_add_i32(tcg_ctx_00,pTVar14,pTVar11,pTVar14);
      break;
    case 1:
      tcg_gen_add_i32(tcg_ctx_00,pTVar14,pTVar11,pTVar14);
      goto LAB_00776640;
    case 2:
      tcg_gen_sub_i32(tcg_ctx_00,pTVar14,pTVar11,pTVar14);
      break;
    case 3:
      tcg_gen_sub_i32(tcg_ctx_00,pTVar14,pTVar11,pTVar14);
LAB_00776640:
      tcg_gen_sub_i32(tcg_ctx_00,pTVar13,pTVar12,pTVar13);
    default:
      goto switchD_007765db_default;
    }
    tcg_gen_add_i32(tcg_ctx_00,pTVar13,pTVar12,pTVar13);
switchD_007765db_default:
    gen_store_mxu_gpr(tcg_ctx_00,pTVar14,uVar1);
    gen_store_mxu_gpr(tcg_ctx_00,pTVar13,uVar4);
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar11 + (long)tcg_ctx_00));
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar12 + (long)tcg_ctx_00));
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar13 + (long)tcg_ctx_00));
    pTVar17 = (TCGTemp *)(pTVar14 + (long)tcg_ctx_00);
    goto LAB_00776cc9;
  case 0x10:
    uVar1 = extract32((env->active_tc).gpr[10],0x14,1);
    if (1 < uVar1) goto switchD_007756f8_caseD_0;
    tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar10 = tcg_temp_new_i32(tcg_ctx_00);
    uVar1 = extract32((env->active_tc).gpr[10],6,4);
    uVar2 = extract32((env->active_tc).gpr[10],10,10);
    uVar3 = extract32((env->active_tc).gpr[10],0x14,1);
    uVar4 = extract32((env->active_tc).gpr[10],0x15,5);
    gen_load_gpr(tcg_ctx_00,pTVar9,uVar4);
    tcg_gen_movi_i32(tcg_ctx_00,pTVar10,uVar2);
    tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar10,pTVar10,2);
    if ((uVar2 >> 9 & 1) != 0) {
      tcg_gen_ori_i32_mipsel(tcg_ctx_00,pTVar10,pTVar10,-0x1000);
    }
    tcg_gen_add_i32(tcg_ctx_00,pTVar10,pTVar9,pTVar10);
    tcg_gen_qemu_ld_i32_mipsel
              (tcg_ctx_00,pTVar10,pTVar10,(long)(int)(env->active_tc).gpr[0x12],MO_LESL);
    if (uVar3 == 1) {
      tcg_gen_bswap32_i32_mipsel(tcg_ctx_00,pTVar10,pTVar10);
    }
    gen_store_mxu_gpr(tcg_ctx_00,pTVar10,uVar1);
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar9 + (long)tcg_ctx_00));
    pTVar17 = (TCGTemp *)(pTVar10 + (long)tcg_ctx_00);
LAB_00776cc9:
    tcg_temp_free_internal_mipsel(tcg_ctx_00,pTVar17);
    goto switchD_0077606e_default;
  case 0x11:
  case 0x14:
    extract32((env->active_tc).gpr[10],0x14,1);
    goto LAB_00775f49;
  case 0x12:
  case 0x13:
  case 0x17:
    uVar1 = (env->active_tc).gpr[10];
    iVar18 = 10;
    iVar16 = 4;
    goto LAB_00775f3e;
  case 0x15:
  case 0x16:
    uVar1 = (env->active_tc).gpr[10];
    iVar18 = 5;
    iVar16 = 0;
    goto LAB_00775f3e;
  case 0x19:
  case 0x1b:
  case 0x1c:
  case 0x3a:
    uVar1 = (env->active_tc).gpr[10];
    iVar18 = 0x16;
    break;
  case 0x22:
    tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
    pTVar10 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar11 = tcg_temp_new_i32(tcg_ctx_00);
    uVar1 = extract32((env->active_tc).gpr[10],6,4);
    uVar2 = extract32((env->active_tc).gpr[10],10,8);
    uVar3 = extract32((env->active_tc).gpr[10],0x12,3);
    uVar4 = extract32((env->active_tc).gpr[10],0x15,5);
    gen_load_gpr(tcg_ctx_00,pTVar10,uVar4);
    tcg_gen_addi_i32_mipsel(tcg_ctx_00,pTVar10,pTVar10,(int)(char)uVar2);
    pTVar9 = pTVar10;
    switch(uVar3) {
    case 0:
      tcg_gen_qemu_ld_i32_mipsel
                (tcg_ctx_00,pTVar11,pTVar10,(long)(int)(env->active_tc).gpr[0x12],MO_8);
      gen_load_mxu_gpr(tcg_ctx_00,pTVar10,uVar1);
      uVar7 = 0;
      len = 8;
      break;
    case 1:
      tcg_gen_qemu_ld_i32_mipsel
                (tcg_ctx_00,pTVar11,pTVar10,(long)(int)(env->active_tc).gpr[0x12],MO_8);
      gen_load_mxu_gpr(tcg_ctx_00,pTVar10,uVar1);
      uVar7 = 8;
      len = uVar7;
      break;
    case 2:
      tcg_gen_qemu_ld_i32_mipsel
                (tcg_ctx_00,pTVar11,pTVar10,(long)(int)(env->active_tc).gpr[0x12],MO_8);
      gen_load_mxu_gpr(tcg_ctx_00,pTVar10,uVar1);
      uVar7 = 0x10;
      goto LAB_007767a6;
    case 3:
      tcg_gen_qemu_ld_i32_mipsel
                (tcg_ctx_00,pTVar11,pTVar10,(long)(int)(env->active_tc).gpr[0x12],MO_8);
      gen_load_mxu_gpr(tcg_ctx_00,pTVar10,uVar1);
      uVar7 = 0x18;
LAB_007767a6:
      len = 8;
      break;
    case 4:
      tcg_gen_qemu_ld_i32_mipsel
                (tcg_ctx_00,pTVar11,pTVar10,(long)(int)(env->active_tc).gpr[0x12],MO_8);
      goto LAB_00776847;
    case 5:
      tcg_gen_qemu_ld_i32_mipsel
                (tcg_ctx_00,pTVar11,pTVar10,(long)(int)(env->active_tc).gpr[0x12],MO_8);
      tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar11,pTVar11,8);
      goto LAB_00776847;
    case 6:
      tcg_gen_qemu_ld_i32_mipsel
                (tcg_ctx_00,pTVar11,pTVar10,(long)(int)(env->active_tc).gpr[0x12],MO_ASHIFT);
      tcg_gen_mov_i32(tcg_ctx_00,pTVar10,pTVar11);
      tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar10,pTVar10,-0xff0001);
      tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar11,pTVar11,0x10);
      tcg_gen_or_i32(tcg_ctx_00,pTVar10,pTVar10,pTVar11);
      goto switchD_007759ef_default;
    case 7:
      tcg_gen_qemu_ld_i32_mipsel
                (tcg_ctx_00,pTVar11,pTVar10,(long)(int)(env->active_tc).gpr[0x12],MO_8);
      tcg_gen_deposit_i32_mipsel(tcg_ctx_00,pTVar11,pTVar11,pTVar11,8,8);
LAB_00776847:
      uVar7 = 0x10;
      pTVar9 = pTVar11;
      len = uVar7;
      break;
    default:
      goto switchD_007759ef_default;
    }
    tcg_gen_deposit_i32_mipsel(tcg_ctx_00,pTVar10,pTVar9,pTVar11,uVar7,len);
switchD_007759ef_default:
    gen_store_mxu_gpr(tcg_ctx_00,pTVar10,uVar1);
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar10 + (long)tcg_ctx_00));
    pTVar17 = (TCGTemp *)(pTVar11 + (long)tcg_ctx_00);
LAB_00776884:
    tcg_temp_free_internal_mipsel(tcg_ctx_00,pTVar17);
    goto switchD_0077606e_default;
  case 0x26:
    uVar1 = (env->active_tc).gpr[10];
    iVar18 = 0xe;
    break;
  case 0x27:
    uVar1 = extract32((env->active_tc).gpr[10],0x12,3);
    switch(uVar1) {
    default:
      goto switchD_007756f8_caseD_0;
    case 2:
      tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
      uVar1 = extract32((env->active_tc).gpr[10],0x17,3);
      uVar2 = extract32((env->active_tc).gpr[10],0x15,2);
      uVar3 = extract32((env->active_tc).gpr[10],0xe,4);
      uVar4 = extract32((env->active_tc).gpr[10],10,4);
      uVar5 = extract32((env->active_tc).gpr[10],6,4);
      if ((uVar2 == 0) && (uVar5 != 0)) {
        if (uVar4 == 0 && uVar3 == 0) {
LAB_007773e4:
          pTVar9 = tcg_ctx_00->mxu_gpr[uVar5 - 1];
          goto LAB_007773f2;
        }
        if (uVar4 == 0) {
          if (uVar1 - 1 < 3) {
            pTVar9 = tcg_ctx_00->mxu_gpr[uVar5 - 1];
            pTVar10 = tcg_ctx_00->mxu_gpr[uVar3 - 1];
            iVar15 = uVar1 * -8 + 0x20;
LAB_0077737f:
            tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar9,pTVar10,iVar15);
          }
          else if (uVar1 == 4) {
            tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],tcg_ctx_00->mxu_gpr[uVar3 - 1]
                           );
          }
          else if (uVar1 == 0) goto LAB_007773e4;
        }
        else if (uVar3 == 0) {
          if (uVar1 - 1 < 3) {
            pTVar9 = tcg_ctx_00->mxu_gpr[uVar5 - 1];
            pTVar10 = tcg_ctx_00->mxu_gpr[uVar4 - 1];
            iVar15 = uVar1 << 3;
            goto LAB_0077737f;
          }
          if (uVar1 == 4) {
            tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],0);
          }
          else if (uVar1 == 0) goto switchD_0077606e_caseD_0;
        }
        else {
          if (uVar4 != uVar3) {
            switch(uVar1) {
            case 0:
switchD_0077606e_caseD_0:
              pTVar9 = tcg_ctx_00->mxu_gpr[uVar5 - 1];
              pTVar10 = tcg_ctx_00->mxu_gpr[uVar4 - 1];
              goto LAB_00777449;
            case 1:
              pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
              pTVar10 = tcg_temp_new_i32(tcg_ctx_00);
              tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar4 - 1],0xffffff);
              tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,8);
              tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar10,tcg_ctx_00->mxu_gpr[uVar3 - 1],-0x1000000);
              iVar15 = 0x18;
              break;
            case 2:
              pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
              pTVar10 = tcg_temp_new_i32(tcg_ctx_00);
              tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar4 - 1],0xffff);
              iVar15 = 0x10;
              tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,0x10);
              tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar10,tcg_ctx_00->mxu_gpr[uVar3 - 1],-0x10000);
              break;
            case 3:
              pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
              pTVar10 = tcg_temp_new_i32(tcg_ctx_00);
              tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar4 - 1],0xff);
              tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,0x18);
              tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar10,tcg_ctx_00->mxu_gpr[uVar3 - 1],-0x100);
              iVar15 = 8;
              break;
            case 4:
switchD_0077606e_caseD_4:
              pTVar9 = tcg_ctx_00->mxu_gpr[uVar5 - 1];
              pTVar10 = tcg_ctx_00->mxu_gpr[uVar3 - 1];
              goto LAB_00777449;
            default:
              goto switchD_0077606e_default;
            }
            tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar10,pTVar10,iVar15);
            tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],pTVar9,pTVar10);
            pTVar17 = (TCGTemp *)(pTVar10 + (long)tcg_ctx_00);
            goto LAB_00776cbb;
          }
          if (uVar1 - 1 < 3) {
            tcg_gen_rotli_i32_mipsel
                      (tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar5 - 1],tcg_ctx_00->mxu_gpr[uVar3 - 1],
                       uVar1 << 3);
          }
          else if ((uVar1 == 4) || (uVar1 == 0)) goto switchD_0077606e_caseD_4;
        }
      }
      break;
    case 4:
      tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
      uVar1 = extract32((env->active_tc).gpr[10],0x15,5);
      uVar2 = extract32((env->active_tc).gpr[10],0xe,4);
      uVar3 = extract32((env->active_tc).gpr[10],10,4);
      uVar4 = extract32((env->active_tc).gpr[10],6,4);
      if ((uVar1 == 0) && (uVar4 != 0)) {
        uVar7 = uVar4 - 1;
        if (uVar3 == 0 && uVar2 == 0) {
          pTVar9 = tcg_ctx_00->mxu_gpr[uVar7];
          iVar15 = -1;
          goto LAB_007773f4;
        }
        if (uVar3 == 0) {
          pTVar9 = tcg_ctx_00->mxu_gpr[uVar7];
LAB_00777151:
          pTVar10 = tcg_ctx_00->mxu_gpr[uVar2 - 1];
        }
        else {
          if (uVar2 != 0) {
            pTVar9 = tcg_ctx_00->mxu_gpr[uVar7];
            if (uVar3 != uVar2) {
              tcg_gen_nor_i32_mipsel
                        (tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar3 - 1],
                         tcg_ctx_00->mxu_gpr[uVar2 - 1]);
              break;
            }
            goto LAB_00777151;
          }
          pTVar9 = tcg_ctx_00->mxu_gpr[uVar7];
          pTVar10 = tcg_ctx_00->mxu_gpr[uVar3 - 1];
        }
        tcg_gen_not_i32(tcg_ctx_00,pTVar9,pTVar10);
      }
      break;
    case 5:
      tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
      uVar1 = extract32((env->active_tc).gpr[10],0x15,5);
      uVar2 = extract32((env->active_tc).gpr[10],0xe,4);
      uVar3 = extract32((env->active_tc).gpr[10],10,4);
      uVar4 = extract32((env->active_tc).gpr[10],6,4);
      if ((uVar1 == 0) && (uVar4 != 0)) {
        if ((uVar3 == 0) || (uVar2 == 0)) {
          pTVar9 = tcg_ctx_00->mxu_gpr[uVar4 - 1];
          goto LAB_007773f2;
        }
        pTVar9 = tcg_ctx_00->mxu_gpr[uVar4 - 1];
        if (uVar3 == uVar2) {
          pTVar10 = tcg_ctx_00->mxu_gpr[uVar2 - 1];
          goto LAB_00777449;
        }
        tcg_gen_and_i32(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar3 - 1],
                        tcg_ctx_00->mxu_gpr[uVar2 - 1]);
      }
      break;
    case 6:
      tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
      uVar2 = extract32((env->active_tc).gpr[10],0x15,5);
      uVar1 = extract32((env->active_tc).gpr[10],0xe,4);
      uVar3 = extract32((env->active_tc).gpr[10],10,4);
      uVar4 = extract32((env->active_tc).gpr[10],6,4);
      if ((uVar2 == 0) && (uVar4 != 0)) {
        if (uVar3 == 0 && uVar1 == 0) {
LAB_00776f69:
          pTVar9 = tcg_ctx_00->mxu_gpr[uVar4 - 1];
          goto LAB_007773f2;
        }
        if (uVar3 == 0) {
LAB_00776f7b:
          pTVar9 = tcg_ctx_00->mxu_gpr[uVar4 - 1];
        }
        else {
          if (uVar1 == 0) {
LAB_00777107:
            pTVar9 = tcg_ctx_00->mxu_gpr[uVar4 - 1];
            pTVar10 = tcg_ctx_00->mxu_gpr[uVar3 - 1];
            goto LAB_00777449;
          }
          pTVar9 = tcg_ctx_00->mxu_gpr[uVar4 - 1];
          if (uVar3 != uVar1) {
            tcg_gen_or_i32(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar3 - 1],
                           tcg_ctx_00->mxu_gpr[uVar1 - 1]);
            break;
          }
        }
        pTVar10 = tcg_ctx_00->mxu_gpr[uVar1 - 1];
LAB_00777449:
        tcg_gen_mov_i32(tcg_ctx_00,pTVar9,pTVar10);
      }
      break;
    case 7:
      tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
      uVar2 = extract32((env->active_tc).gpr[10],0x15,5);
      uVar1 = extract32((env->active_tc).gpr[10],0xe,4);
      uVar3 = extract32((env->active_tc).gpr[10],10,4);
      uVar4 = extract32((env->active_tc).gpr[10],6,4);
      if ((uVar2 == 0) && (uVar4 != 0)) {
        if (uVar3 == 0 && uVar1 == 0) goto LAB_00776f69;
        if (uVar3 == 0) goto LAB_00776f7b;
        if (uVar1 == 0) goto LAB_00777107;
        pTVar9 = tcg_ctx_00->mxu_gpr[uVar4 - 1];
        if (uVar3 == uVar1) goto LAB_007773f2;
        tcg_gen_xor_i32(tcg_ctx_00,pTVar9,tcg_ctx_00->mxu_gpr[uVar3 - 1],
                        tcg_ctx_00->mxu_gpr[uVar1 - 1]);
      }
    }
    goto switchD_0077606e_default;
  case 0x28:
    uVar1 = (env->active_tc).gpr[10];
    iVar18 = 6;
    break;
  case 0x38:
    uVar1 = extract32((env->active_tc).gpr[10],0x16,2);
    if (1 < uVar1) goto switchD_007756f8_caseD_0;
    tcg_ctx_00 = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar10 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar11 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar12 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar13 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar14 = tcg_temp_new_i32(tcg_ctx_00);
    ret = tcg_temp_new_i32(tcg_ctx_00);
    t = tcg_temp_new_i32(tcg_ctx_00);
    uVar1 = extract32((env->active_tc).gpr[10],6,4);
    uVar2 = extract32((env->active_tc).gpr[10],10,4);
    uVar3 = extract32((env->active_tc).gpr[10],0xe,4);
    uVar4 = extract32((env->active_tc).gpr[10],0x12,4);
    uVar5 = extract32((env->active_tc).gpr[10],0x16,2);
    gen_load_mxu_gpr(tcg_ctx_00,pTVar12,uVar2);
    gen_load_mxu_gpr(tcg_ctx_00,t,uVar3);
    if (uVar5 == 2) {
      tcg_gen_ext8s_i32_mipsel(tcg_ctx_00,pTVar9,pTVar12);
      tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar12,pTVar12,8);
      tcg_gen_ext8s_i32_mipsel(tcg_ctx_00,pTVar10,pTVar12);
      tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar12,pTVar12,8);
      tcg_gen_ext8s_i32_mipsel(tcg_ctx_00,pTVar11,pTVar12);
      tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar12,pTVar12,8);
      tcg_gen_ext8s_i32_mipsel(tcg_ctx_00,pTVar12,pTVar12);
    }
    else {
      tcg_gen_ext8u_i32_mipsel(tcg_ctx_00,pTVar9,pTVar12);
      tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar12,pTVar12,8);
      tcg_gen_ext8u_i32_mipsel(tcg_ctx_00,pTVar10,pTVar12);
      tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar12,pTVar12,8);
      tcg_gen_ext8u_i32_mipsel(tcg_ctx_00,pTVar11,pTVar12);
      tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar12,pTVar12,8);
      tcg_gen_ext8u_i32_mipsel(tcg_ctx_00,pTVar12,pTVar12);
    }
    tcg_gen_ext8u_i32_mipsel(tcg_ctx_00,pTVar13,t);
    tcg_gen_shri_i32_mipsel(tcg_ctx_00,t,t,8);
    tcg_gen_ext8u_i32_mipsel(tcg_ctx_00,pTVar14,t);
    tcg_gen_shri_i32_mipsel(tcg_ctx_00,t,t,8);
    tcg_gen_ext8u_i32_mipsel(tcg_ctx_00,ret,t);
    tcg_gen_shri_i32_mipsel(tcg_ctx_00,t,t,8);
    tcg_gen_ext8u_i32_mipsel(tcg_ctx_00,t,t);
    tcg_gen_mul_i32(tcg_ctx_00,pTVar9,pTVar9,pTVar13);
    tcg_gen_mul_i32(tcg_ctx_00,pTVar10,pTVar10,pTVar14);
    tcg_gen_mul_i32(tcg_ctx_00,pTVar11,pTVar11,ret);
    tcg_gen_mul_i32(tcg_ctx_00,pTVar12,pTVar12,t);
    tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar9,pTVar9,0xffff);
    tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar10,pTVar10,0xffff);
    tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar11,pTVar11,0xffff);
    tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar12,pTVar12,0xffff);
    tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar10,pTVar10,0x10);
    tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar12,pTVar12,0x10);
    tcg_gen_or_i32(tcg_ctx_00,pTVar9,pTVar9,pTVar10);
    tcg_gen_or_i32(tcg_ctx_00,pTVar10,pTVar11,pTVar12);
    gen_store_mxu_gpr(tcg_ctx_00,pTVar9,uVar4);
    gen_store_mxu_gpr(tcg_ctx_00,pTVar10,uVar1);
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar9 + (long)tcg_ctx_00));
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar10 + (long)tcg_ctx_00));
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar11 + (long)tcg_ctx_00));
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar12 + (long)tcg_ctx_00));
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar13 + (long)tcg_ctx_00));
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(pTVar14 + (long)tcg_ctx_00));
    tcg_temp_free_internal_mipsel(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
    pTVar17 = (TCGTemp *)(t + (long)tcg_ctx_00);
    goto LAB_00776884;
  }
  iVar16 = 2;
LAB_00775f3e:
  extract32(uVar1,iVar18,iVar16);
switchD_007756f8_caseD_0:
LAB_00775f49:
  generate_exception_end((DisasContext_conflict4 *)env,0x14);
switchD_0077606e_default:
  gen_set_label(tcg_ctx,l);
  pTVar17 = (TCGTemp *)(pTVar8 + (long)tcg_ctx);
LAB_00775f66:
  tcg_temp_free_internal_mipsel(tcg_ctx,pTVar17);
  return;
}

Assistant:

static void decode_opc_mxu(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    /*
     * TODO: Investigate necessity of including handling of
     * CLZ, CLO, SDBB in this function, as they belong to
     * SPECIAL2 opcode space for regular pre-R6 MIPS ISAs.
     */
    uint32_t opcode = extract32(ctx->opcode, 0, 6);

    if (opcode == OPC__MXU_MUL) {
        uint32_t  rs, rt, rd, op1;

        rs = extract32(ctx->opcode, 21, 5);
        rt = extract32(ctx->opcode, 16, 5);
        rd = extract32(ctx->opcode, 11, 5);
        op1 = MASK_SPECIAL2(ctx->opcode);

        gen_arith(ctx, op1, rd, rs, rt);

        return;
    }

    if (opcode == OPC_MXU_S32M2I) {
        gen_mxu_s32m2i(ctx);
        return;
    }

    if (opcode == OPC_MXU_S32I2M) {
        gen_mxu_s32i2m(ctx);
        return;
    }

    {
        TCGv t_mxu_cr = tcg_temp_new(tcg_ctx);
        TCGLabel *l_exit = gen_new_label(tcg_ctx);

        gen_load_mxu_cr(tcg_ctx, t_mxu_cr);
        tcg_gen_andi_tl(tcg_ctx, t_mxu_cr, t_mxu_cr, MXU_CR_MXU_EN);
        tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t_mxu_cr, MXU_CR_MXU_EN, l_exit);

        switch (opcode) {
        case OPC_MXU_S32MADD:
            /* TODO: Implement emulation of S32MADD instruction. */
            MIPS_INVAL("OPC_MXU_S32MADD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S32MADDU:
            /* TODO: Implement emulation of S32MADDU instruction. */
            MIPS_INVAL("OPC_MXU_S32MADDU");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL00:
            decode_opc_mxu__pool00(env, ctx);
            break;
        case OPC_MXU_S32MSUB:
            /* TODO: Implement emulation of S32MSUB instruction. */
            MIPS_INVAL("OPC_MXU_S32MSUB");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S32MSUBU:
            /* TODO: Implement emulation of S32MSUBU instruction. */
            MIPS_INVAL("OPC_MXU_S32MSUBU");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL01:
            decode_opc_mxu__pool01(env, ctx);
            break;
        case OPC_MXU__POOL02:
            decode_opc_mxu__pool02(env, ctx);
            break;
        case OPC_MXU_D16MUL:
            gen_mxu_d16mul(ctx);
            break;
        case OPC_MXU__POOL03:
            decode_opc_mxu__pool03(env, ctx);
            break;
        case OPC_MXU_D16MAC:
            gen_mxu_d16mac(ctx);
            break;
        case OPC_MXU_D16MACF:
            /* TODO: Implement emulation of D16MACF instruction. */
            MIPS_INVAL("OPC_MXU_D16MACF");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_D16MADL:
            /* TODO: Implement emulation of D16MADL instruction. */
            MIPS_INVAL("OPC_MXU_D16MADL");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S16MAD:
            /* TODO: Implement emulation of S16MAD instruction. */
            MIPS_INVAL("OPC_MXU_S16MAD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_Q16ADD:
            /* TODO: Implement emulation of Q16ADD instruction. */
            MIPS_INVAL("OPC_MXU_Q16ADD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_D16MACE:
            /* TODO: Implement emulation of D16MACE instruction. */
            MIPS_INVAL("OPC_MXU_D16MACE");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL04:
            decode_opc_mxu__pool04(env, ctx);
            break;
        case OPC_MXU__POOL05:
            decode_opc_mxu__pool05(env, ctx);
            break;
        case OPC_MXU__POOL06:
            decode_opc_mxu__pool06(env, ctx);
            break;
        case OPC_MXU__POOL07:
            decode_opc_mxu__pool07(env, ctx);
            break;
        case OPC_MXU__POOL08:
            decode_opc_mxu__pool08(env, ctx);
            break;
        case OPC_MXU__POOL09:
            decode_opc_mxu__pool09(env, ctx);
            break;
        case OPC_MXU__POOL10:
            decode_opc_mxu__pool10(env, ctx);
            break;
        case OPC_MXU__POOL11:
            decode_opc_mxu__pool11(env, ctx);
            break;
        case OPC_MXU_D32ADD:
            /* TODO: Implement emulation of D32ADD instruction. */
            MIPS_INVAL("OPC_MXU_D32ADD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL12:
            decode_opc_mxu__pool12(env, ctx);
            break;
        case OPC_MXU__POOL13:
            decode_opc_mxu__pool13(env, ctx);
            break;
        case OPC_MXU__POOL14:
            decode_opc_mxu__pool14(env, ctx);
            break;
        case OPC_MXU_Q8ACCE:
            /* TODO: Implement emulation of Q8ACCE instruction. */
            MIPS_INVAL("OPC_MXU_Q8ACCE");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S8LDD:
            gen_mxu_s8ldd(ctx);
            break;
        case OPC_MXU_S8STD:
            /* TODO: Implement emulation of S8STD instruction. */
            MIPS_INVAL("OPC_MXU_S8STD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S8LDI:
            /* TODO: Implement emulation of S8LDI instruction. */
            MIPS_INVAL("OPC_MXU_S8LDI");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S8SDI:
            /* TODO: Implement emulation of S8SDI instruction. */
            MIPS_INVAL("OPC_MXU_S8SDI");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL15:
            decode_opc_mxu__pool15(env, ctx);
            break;
        case OPC_MXU__POOL16:
            decode_opc_mxu__pool16(env, ctx);
            break;
        case OPC_MXU__POOL17:
            decode_opc_mxu__pool17(env, ctx);
            break;
        case OPC_MXU_S16LDD:
            /* TODO: Implement emulation of S16LDD instruction. */
            MIPS_INVAL("OPC_MXU_S16LDD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S16STD:
            /* TODO: Implement emulation of S16STD instruction. */
            MIPS_INVAL("OPC_MXU_S16STD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S16LDI:
            /* TODO: Implement emulation of S16LDI instruction. */
            MIPS_INVAL("OPC_MXU_S16LDI");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S16SDI:
            /* TODO: Implement emulation of S16SDI instruction. */
            MIPS_INVAL("OPC_MXU_S16SDI");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_D32SLL:
            /* TODO: Implement emulation of D32SLL instruction. */
            MIPS_INVAL("OPC_MXU_D32SLL");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_D32SLR:
            /* TODO: Implement emulation of D32SLR instruction. */
            MIPS_INVAL("OPC_MXU_D32SLR");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_D32SARL:
            /* TODO: Implement emulation of D32SARL instruction. */
            MIPS_INVAL("OPC_MXU_D32SARL");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_D32SAR:
            /* TODO: Implement emulation of D32SAR instruction. */
            MIPS_INVAL("OPC_MXU_D32SAR");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_Q16SLL:
            /* TODO: Implement emulation of Q16SLL instruction. */
            MIPS_INVAL("OPC_MXU_Q16SLL");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_Q16SLR:
            /* TODO: Implement emulation of Q16SLR instruction. */
            MIPS_INVAL("OPC_MXU_Q16SLR");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL18:
            decode_opc_mxu__pool18(env, ctx);
            break;
        case OPC_MXU_Q16SAR:
            /* TODO: Implement emulation of Q16SAR instruction. */
            MIPS_INVAL("OPC_MXU_Q16SAR");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU__POOL19:
            decode_opc_mxu__pool19(env, ctx);
            break;
        case OPC_MXU__POOL20:
            decode_opc_mxu__pool20(env, ctx);
            break;
        case OPC_MXU__POOL21:
            decode_opc_mxu__pool21(env, ctx);
            break;
        case OPC_MXU_Q16SCOP:
            /* TODO: Implement emulation of Q16SCOP instruction. */
            MIPS_INVAL("OPC_MXU_Q16SCOP");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_Q8MADL:
            /* TODO: Implement emulation of Q8MADL instruction. */
            MIPS_INVAL("OPC_MXU_Q8MADL");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_S32SFL:
            /* TODO: Implement emulation of S32SFL instruction. */
            MIPS_INVAL("OPC_MXU_S32SFL");
            generate_exception_end(ctx, EXCP_RI);
            break;
        case OPC_MXU_Q8SAD:
            /* TODO: Implement emulation of Q8SAD instruction. */
            MIPS_INVAL("OPC_MXU_Q8SAD");
            generate_exception_end(ctx, EXCP_RI);
            break;
        default:
            MIPS_INVAL("decode_opc_mxu");
            generate_exception_end(ctx, EXCP_RI);
        }

        gen_set_label(tcg_ctx, l_exit);
        tcg_temp_free(tcg_ctx, t_mxu_cr);
    }
}